

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-utils.h
# Opt level: O1

uint32_t helper_rbit_arm(uint32_t x)

{
  uint uVar1;
  
  uVar1 = x >> 0x18 | (x & 0xff0000) >> 8 | (x & 0xff00) << 8 | x << 0x18;
  uVar1 = (uVar1 & 0xf0f0f0f) << 4 | uVar1 >> 4 & 0xf0f0f0f;
  uVar1 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0x33333333) * 4;
  return (uVar1 >> 1 & 0x55555555) + (uVar1 & 0x55555555) * 2;
}

Assistant:

static inline uint32_t revbit32(uint32_t x)
{
    /* Assign the correct byte position.  */
    x = bswap32(x);
    /* Assign the correct nibble position.  */
    x = ((x & 0xf0f0f0f0u) >> 4)
      | ((x & 0x0f0f0f0fu) << 4);
    /* Assign the correct bit position.  */
    x = ((x & 0x88888888u) >> 3)
      | ((x & 0x44444444u) >> 1)
      | ((x & 0x22222222u) << 1)
      | ((x & 0x11111111u) << 3);
    return x;
}